

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TexParamVerifier *pTVar2;
  int iVar3;
  GetTexParameterIVerifier *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  GetTexParameterFVerifier *this_01;
  undefined4 extraout_var_00;
  TextureWrapCase *pTVar7;
  char *pcVar8;
  TestNode *pTVar9;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  TexParamVerifier *local_1b8;
  TexParamVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  TexParamVerifier *local_148;
  TexParamVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  TexParamVerifier *local_d8;
  TexParamVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  TexParamVerifier *local_68;
  TexParamVerifier *verifier;
  int _verifierNdx;
  int ndx;
  anon_struct_16_2_7a662c2c textureTargets [2];
  TexParamVerifier *verifiers [2];
  TextureStateQueryTests *this_local;
  
  this_00 = (GetTexParameterIVerifier *)operator_new(0x28);
  pRVar4 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  TextureParamVerifiers::GetTexParameterIVerifier::GetTexParameterIVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  this->m_verifierInt = this_00;
  this_01 = (GetTexParameterFVerifier *)operator_new(0x28);
  pRVar4 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  TextureParamVerifiers::GetTexParameterFVerifier::GetTexParameterFVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar3),pTVar6);
  this->m_verifierFloat = this_01;
  textureTargets[1]._8_8_ = this->m_verifierInt;
  __verifierNdx = "texture_2d";
  textureTargets[0].name = (char *)0xde1;
  textureTargets[0]._8_8_ = anon_var_dwarf_2dfb5c;
  textureTargets[1].name = (char *)0x8513;
  verifier._4_4_ = 0;
  iVar3 = 0x8513;
  while (verifier._4_4_ < 2) {
    for (verifier._0_4_ = 0; (int)verifier < 2; verifier._0_4_ = (int)verifier + 1) {
      local_68 = verifiers[(long)(int)verifier + -1];
      pTVar7 = (TextureWrapCase *)operator_new(0xb0);
      pTVar2 = local_68;
      verifier_1._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)verifier._4_4_ * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_1,pcVar8,(allocator<char> *)((long)&verifier_1 + 7));
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_1,"_texture_wrap_s");
      pcVar8 = TextureParamVerifiers::TexParamVerifier::getTestNamePostfix(local_68);
      std::operator+(&local_88,&local_a8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::TextureWrapCase::TextureWrapCase
                (pTVar7,pCVar1,pTVar2,pcVar8,"TEXTURE_WRAP_S",
                 *(GLenum *)&textureTargets[verifier._4_4_].name,0x2802);
      verifier_1._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&_verifierNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    }
    for (verifier_1._0_4_ = 0; (int)verifier_1 < 2; verifier_1._0_4_ = (int)verifier_1 + 1) {
      local_d8 = verifiers[(long)(int)verifier_1 + -1];
      pTVar7 = (TextureWrapCase *)operator_new(0xb0);
      pTVar2 = local_d8;
      verifier_2._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)verifier._4_4_ * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_2,pcVar8,(allocator<char> *)((long)&verifier_2 + 7));
      std::operator+(&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_2,"_texture_wrap_t");
      pcVar8 = TextureParamVerifiers::TexParamVerifier::getTestNamePostfix(local_d8);
      std::operator+(&local_f8,&local_118,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::TextureWrapCase::TextureWrapCase
                (pTVar7,pCVar1,pTVar2,pcVar8,"TEXTURE_WRAP_T",
                 *(GLenum *)&textureTargets[verifier._4_4_].name,0x2803);
      verifier_2._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&_verifierNdx_2);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    }
    for (verifier_2._0_4_ = 0; (int)verifier_2 < 2; verifier_2._0_4_ = (int)verifier_2 + 1) {
      local_148 = verifiers[(long)(int)verifier_2 + -1];
      pTVar9 = (TestNode *)operator_new(0xa8);
      pTVar2 = local_148;
      verifier_3._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)verifier._4_4_ * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_3,pcVar8,(allocator<char> *)((long)&verifier_3 + 7));
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_3,"_texture_mag_filter");
      pcVar8 = TextureParamVerifiers::TexParamVerifier::getTestNamePostfix(local_148);
      std::operator+(&local_168,&local_188,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::TextureMagFilterCase::TextureMagFilterCase
                ((TextureMagFilterCase *)pTVar9,pCVar1,pTVar2,pcVar8,"TEXTURE_MAG_FILTER",
                 *(GLenum *)&textureTargets[verifier._4_4_].name);
      verifier_3._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&_verifierNdx_3);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
    }
    for (verifier_3._0_4_ = 0; (int)verifier_3 < 2; verifier_3._0_4_ = (int)verifier_3 + 1) {
      local_1b8 = verifiers[(long)(int)verifier_3 + -1];
      pTVar9 = (TestNode *)operator_new(0xa8);
      pTVar2 = local_1b8;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)verifier._4_4_ * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar8,&local_219);
      std::operator+(&local_1f8,&local_218,"_texture_min_filter");
      pcVar8 = TextureParamVerifiers::TexParamVerifier::getTestNamePostfix(local_1b8);
      std::operator+(&local_1d8,&local_1f8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::TextureMinFilterCase::TextureMinFilterCase
                ((TextureMinFilterCase *)pTVar9,pCVar1,pTVar2,pcVar8,"TEXTURE_MIN_FILTER",
                 *(GLenum *)&textureTargets[verifier._4_4_].name);
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
    }
    verifier._4_4_ = verifier._4_4_ + 1;
    iVar3 = verifier._4_4_;
  }
  return iVar3;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	using namespace TextureParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierInt		= new GetTexParameterIVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat		= new GetTexParameterFVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	TexParamVerifier* verifiers[] = {m_verifierInt, m_verifierFloat};

	const struct
	{
		const char*	name;
		GLenum		textureTarget;
	} textureTargets[] =
	{
		{ "texture_2d",			GL_TEXTURE_2D},
		{ "texture_cube_map",	GL_TEXTURE_CUBE_MAP}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTargets); ++ndx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_s"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_S",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_S)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_t"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_T",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_T)));

		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMagFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_mag_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MAG_FILTER",	textureTargets[ndx].textureTarget)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMinFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_min_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MIN_FILTER",	textureTargets[ndx].textureTarget)));
	}
}